

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positional_reference_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::PositionalReferenceExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PositionalReferenceExpression *this)

{
  ulong __val;
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  char cVar7;
  string __str;
  char *local_40;
  uint local_38;
  char local_30 [16];
  
  __val = this->index;
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00e58e7c;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00e58e7c;
      }
      if (uVar5 < 10000) goto LAB_00e58e7c;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_00e58e7c:
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct((ulong)&local_40,cVar7);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_40,local_38,__val);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1f09c5e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string PositionalReferenceExpression::ToString() const {
	return "#" + to_string(index);
}